

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  Btree *pBtree;
  BtShared *pBVar1;
  MemPage *pPage_00;
  u16 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint iChild;
  int iVar6;
  int *pRC;
  undefined1 in_SIL;
  undefined1 *in_RDI;
  uchar *pTmp;
  Pgno n;
  int nCell;
  MemPage *pLeaf;
  u8 bPreserve;
  int bSkipnext;
  CellInfo info;
  int iCellDepth;
  int iCellIdx;
  uchar *pCell;
  MemPage *pPage;
  int rc;
  BtShared *pBt;
  Btree *p;
  BtCursor *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  Pgno in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int *in_stack_ffffffffffffff80;
  int *pRC_00;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  MemPage *in_stack_ffffffffffffff90;
  MemPage *pPage_01;
  undefined3 in_stack_ffffffffffffff98;
  uint uVar7;
  char cVar8;
  int sz;
  u8 *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  BtCursor *in_stack_ffffffffffffffb0;
  int local_2c;
  int local_4;
  
  pBtree = *(Btree **)(in_RDI + 8);
  pBVar1 = pBtree->pBt;
  sz = 0;
  uVar7 = CONCAT13(in_SIL,in_stack_ffffffffffffff98) & 0x2ffffff;
  iVar3 = (int)(char)in_RDI[0x54];
  uVar4 = (uint)*(ushort *)(in_RDI + 0x56);
  pPage_00 = *(MemPage **)(in_RDI + 0x88);
  if ((char)(uVar7 >> 0x18) != '\0') {
    if (pPage_00->leaf != '\0') {
      in_stack_ffffffffffffff78 = (uint)pPage_00->nFree;
      uVar2 = cellSizePtr(pPage_00,pPage_00->aData +
                                   (int)(uint)(pPage_00->maskPage &
                                              CONCAT11(pPage_00->aCellIdx[(int)(uVar4 << 1)],
                                                       pPage_00->aCellIdx
                                                       [(long)(int)(uVar4 << 1) + 1])));
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff78 + uVar2 + 2;
      if (in_stack_ffffffffffffff7c <= (int)((pBVar1->usableSize << 1) / 3)) {
        sz = 1;
        goto LAB_0016a16a;
      }
    }
    iVar5 = saveCursorKey((BtCursor *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    if (iVar5 != 0) {
      return iVar5;
    }
  }
LAB_0016a16a:
  if (((pPage_00->leaf != '\0') ||
      (local_4 = sqlite3BtreePrevious(in_stack_ffffffffffffff68,0), local_4 == 0)) &&
     (((in_RDI[1] & 0x20) == 0 ||
      (local_4 = saveAllCursors((BtShared *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                in_stack_ffffffffffffff74,in_stack_ffffffffffffff68), local_4 == 0))
     )) {
    if (*(long *)(in_RDI + 0x80) == 0) {
      invalidateIncrblobCursors(pBtree,*(Pgno *)(in_RDI + 0x50),*(i64 *)(in_RDI + 0x30),0);
    }
    local_4 = sqlite3PagerWrite((PgHdr *)in_stack_ffffffffffffff68);
    if (local_4 == 0) {
      local_4 = clearCell((MemPage *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa0,(CellInfo *)CONCAT44(sz,uVar7));
      dropCell(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
      if (local_4 == 0) {
        if (pPage_00->leaf == '\0') {
          pPage_01 = *(MemPage **)(in_RDI + 0x88);
          if (iVar3 < (char)in_RDI[0x54] + -1) {
            iVar5 = *(int *)(*(long *)(in_RDI + (long)(iVar3 + 1) * 8 + 0x90) + 4);
          }
          else {
            iVar5 = *(int *)(*(long *)(in_RDI + 0x88) + 4);
          }
          pRC = (int *)(pPage_01->aData +
                       (int)(uint)(pPage_01->maskPage &
                                  CONCAT11(pPage_01->aCellIdx[(int)((pPage_01->nCell - 1) * 2)],
                                           pPage_01->aCellIdx
                                           [(long)(int)((pPage_01->nCell - 1) * 2) + 1])));
          if (pRC < pPage_01->aData + 4) {
            iVar3 = sqlite3CorruptError(0);
            return iVar3;
          }
          uVar2 = (*pPage_01->xCellSize)(pPage_01,(u8 *)pRC);
          iChild = (uint)uVar2;
          pRC_00 = (int *)pBVar1->pTmpSpace;
          iVar6 = sqlite3PagerWrite((PgHdr *)in_stack_ffffffffffffff68);
          if (iVar6 == 0) {
            insertCell((MemPage *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                       in_stack_ffffffffffffffa0,sz,&pPage_01->isInit,iChild,pRC);
          }
          dropCell(pPage_01,iChild,iVar5,pRC_00);
          if (iVar6 != 0) {
            return iVar6;
          }
        }
        local_2c = balance(in_stack_ffffffffffffffb0);
        cVar8 = (char)(uVar7 >> 0x18);
        if ((local_2c == 0) && (iVar3 < (char)in_RDI[0x54])) {
          releasePageNotNull((MemPage *)0x16a48a);
          in_RDI[0x54] = in_RDI[0x54] + -1;
          while (cVar8 = (char)(uVar7 >> 0x18), iVar3 < (char)in_RDI[0x54]) {
            in_RDI[0x54] = in_RDI[0x54] + -1;
            releasePage((MemPage *)0x16a4dc);
          }
          *(undefined8 *)(in_RDI + 0x88) =
               *(undefined8 *)(in_RDI + (long)(char)in_RDI[0x54] * 8 + 0x90);
          local_2c = balance(in_stack_ffffffffffffffb0);
        }
        if (local_2c == 0) {
          if (sz == 0) {
            local_2c = moveToRoot((BtCursor *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
            if (cVar8 != '\0') {
              btreeReleaseAllCursorPages
                        ((BtCursor *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
              *in_RDI = 3;
            }
            if (local_2c == 0x10) {
              local_2c = 0;
            }
          }
          else {
            *in_RDI = 2;
            if (uVar4 < pPage_00->nCell) {
              *(undefined4 *)(in_RDI + 4) = 1;
            }
            else {
              *(undefined4 *)(in_RDI + 4) = 0xffffffff;
              *(u16 *)(in_RDI + 0x56) = pPage_00->nCell - 1;
            }
          }
        }
        local_4 = local_2c;
      }
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  CellInfo info;                       /* Size of the cell being deleted */
  int bSkipnext = 0;                   /* Leaf cursor in SKIPNEXT state */
  u8 bPreserve = flags & BTREE_SAVEPOSITION;  /* Keep cursor valid */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( pCur->ix<pCur->pPage->nCell );
  assert( pCur->eState==CURSOR_VALID );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  pCell = findCell(pPage, iCellIdx);

  /* If the bPreserve flag is set to true, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before 
  ** returning. 
  **
  ** Or, if the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry. In this case set bSkipnext to true.  */
  if( bPreserve ){
    if( !pPage->leaf 
     || (pPage->nFree+cellSizePtr(pPage,pCell)+2)>(int)(pBt->usableSize*2/3)
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bSkipnext = 1;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bSkipnext ){
      assert( bPreserve && (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}